

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O3

bool __thiscall
duckdb_shell::ShellState::SetOutputMode(ShellState *this,char *mode_str,char *tbl_name)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t __n;
  char *pcVar5;
  char *pcVar6;
  string *psVar7;
  
  __n = strlen(mode_str);
  cVar1 = *mode_str;
  if (__n < 3 || cVar1 != 'l') {
    if (cVar1 != 't') {
      if (cVar1 == 'h') {
        iVar4 = strncmp(mode_str,"html",__n);
        if (iVar4 == 0) {
          this->mode = HTML;
          goto LAB_0020b10e;
        }
      }
      else if (cVar1 == 'c') {
        iVar4 = strncmp(mode_str,"columns",__n);
        if (iVar4 == 0) {
          this->mode = COLUMN;
          if ((this->shellFlgs & 0x80) == 0) {
            this->showHeader = true;
          }
          goto LAB_0020b0ec;
        }
        iVar4 = strncmp(mode_str,"csv",__n);
        if (iVar4 == 0) {
          this->mode = CSV;
          std::__cxx11::string::_M_replace
                    ((ulong)&this->colSeparator,0,(char *)(this->colSeparator)._M_string_length,
                     0x147bf02);
          psVar7 = &this->rowSeparator;
          pcVar6 = (char *)(this->rowSeparator)._M_string_length;
          pcVar5 = "\r\n";
          goto LAB_0020b107;
        }
      }
LAB_0020ae2b:
      bVar2 = false;
LAB_0020ae2d:
      switch((cVar1 + 0x9fU) * '@' | (byte)(cVar1 + 0x9fU) >> 2) {
      case 0:
switchD_0020ae4d_caseD_0:
        iVar4 = strncmp(mode_str,"ascii",__n);
        if (iVar4 == 0) {
          this->mode = ASCII;
          std::__cxx11::string::_M_replace
                    ((ulong)&this->colSeparator,0,(char *)(this->colSeparator)._M_string_length,
                     0x12a8e20);
          psVar7 = &this->rowSeparator;
          pcVar6 = (char *)(this->rowSeparator)._M_string_length;
          pcVar5 = "\x1e";
          goto LAB_0020b107;
        }
        if (cVar1 == 'm') goto switchD_0020ae4d_caseD_3;
        break;
      case 2:
        iVar4 = strncmp(mode_str,"insert",__n);
        if (iVar4 == 0) {
          this->mode = INSERT;
          pcVar6 = "table";
          if (tbl_name != (char *)0x0) {
            pcVar6 = tbl_name;
          }
          SetTableName(this,pcVar6);
          goto LAB_0020b10e;
        }
        if (cVar1 == 'a') goto switchD_0020ae4d_caseD_0;
        if (cVar1 == 'm') goto switchD_0020ae4d_caseD_3;
        if (cVar1 == 'q') goto switchD_0020ae4d_caseD_4;
        break;
      case 3:
switchD_0020ae4d_caseD_3:
        iVar4 = strncmp(mode_str,"markdown",__n);
        if (iVar4 == 0) {
          this->mode = MARKDOWN;
          goto LAB_0020b10e;
        }
        break;
      case 4:
switchD_0020ae4d_caseD_4:
        iVar4 = strncmp(mode_str,"quote",__n);
        if (iVar4 == 0) {
          this->mode = QUOTE;
          pcVar6 = (char *)(this->colSeparator)._M_string_length;
          pcVar5 = ",";
          goto LAB_0020b0df;
        }
        if (cVar1 == 'm') goto switchD_0020ae4d_caseD_3;
        if (cVar1 == 'a') goto switchD_0020ae4d_caseD_0;
      }
      if ((bVar2) && (iVar4 = strncmp(mode_str,"table",__n), iVar4 == 0)) {
        this->mode = TABLE;
      }
      else {
        if (cVar1 == 'j') {
          iVar4 = strncmp(mode_str,"json",__n);
          bVar3 = true;
          if (iVar4 == 0) {
            this->mode = JSON;
            goto LAB_0020b10e;
          }
        }
        else {
          if (cVar1 == 'd') {
            iVar4 = strncmp(mode_str,"duckbox",__n);
            if (iVar4 == 0) {
              this->mode = DUCKBOX;
              goto LAB_0020b10e;
            }
          }
          else if (cVar1 == 'b') {
            iVar4 = strncmp(mode_str,"box",__n);
            if (iVar4 == 0) {
              this->mode = BOX;
              goto LAB_0020b10e;
            }
          }
          else if ((cVar1 == 'l') && (iVar4 = strncmp(mode_str,"latex",__n), iVar4 == 0)) {
            this->mode = LATEX;
            goto LAB_0020b10e;
          }
          bVar3 = false;
        }
        if ((bVar2) && (iVar4 = strncmp(mode_str,"trash",__n), iVar4 == 0)) {
          this->mode = TRASH;
        }
        else {
          if ((!bVar3) || (iVar4 = strncmp(mode_str,"jsonlines",__n), iVar4 != 0)) {
            SetOutputMode();
            return false;
          }
          this->mode = JSONLINES;
        }
      }
      goto LAB_0020b10e;
    }
    iVar4 = strncmp(mode_str,"tcl",__n);
    if (iVar4 == 0) {
      this->mode = TCL;
      pcVar6 = (char *)(this->colSeparator)._M_string_length;
      pcVar5 = " ";
      goto LAB_0020b0df;
    }
    iVar4 = strncmp(mode_str,"tabs",__n);
    bVar2 = true;
    if (iVar4 != 0) goto LAB_0020ae2d;
    this->mode = LIST;
    psVar7 = &this->colSeparator;
    pcVar6 = (char *)(this->colSeparator)._M_string_length;
    pcVar5 = anon_var_dwarf_63f1aec + 7;
  }
  else {
    iVar4 = strncmp(mode_str,"lines",__n);
    if (iVar4 == 0) {
      this->mode = LINE;
    }
    else {
      iVar4 = strncmp(mode_str,"list",__n);
      if (iVar4 != 0) goto LAB_0020ae2b;
      this->mode = LIST;
      pcVar6 = (char *)(this->colSeparator)._M_string_length;
      pcVar5 = "|";
LAB_0020b0df:
      std::__cxx11::string::_M_replace((ulong)&this->colSeparator,0,pcVar6,(ulong)pcVar5);
    }
LAB_0020b0ec:
    psVar7 = &this->rowSeparator;
    pcVar6 = (char *)(this->rowSeparator)._M_string_length;
    pcVar5 = anon_var_dwarf_63f1717 + 8;
  }
LAB_0020b107:
  std::__cxx11::string::_M_replace((ulong)psVar7,0,pcVar6,(ulong)pcVar5);
LAB_0020b10e:
  this->cMode = this->mode;
  return true;
}

Assistant:

bool ShellState::SetOutputMode(const char *mode_str, const char *tbl_name) {
	idx_t n2 = StringLength(mode_str);
	char c2 = mode_str[0];
	if (c2 == 'l' && n2 > 2 && strncmp(mode_str, "lines", n2) == 0) {
		mode = RenderMode::LINE;
		rowSeparator = SEP_Row;
	} else if (c2 == 'c' && strncmp(mode_str, "columns", n2) == 0) {
		mode = RenderMode::COLUMN;
		if ((shellFlgs & SHFLG_HeaderSet) == 0) {
			showHeader = true;
		}
		rowSeparator = SEP_Row;
	} else if (c2 == 'l' && n2 > 2 && strncmp(mode_str, "list", n2) == 0) {
		mode = RenderMode::LIST;
		colSeparator = SEP_Column;
		rowSeparator = SEP_Row;
	} else if (c2 == 'h' && strncmp(mode_str, "html", n2) == 0) {
		mode = RenderMode::HTML;
	} else if (c2 == 't' && strncmp(mode_str, "tcl", n2) == 0) {
		mode = RenderMode::TCL;
		colSeparator = SEP_Space;
		rowSeparator = SEP_Row;
	} else if (c2 == 'c' && strncmp(mode_str, "csv", n2) == 0) {
		mode = RenderMode::CSV;
		colSeparator = SEP_Comma;
		rowSeparator = SEP_CrLf;
	} else if (c2 == 't' && strncmp(mode_str, "tabs", n2) == 0) {
		mode = RenderMode::LIST;
		colSeparator = SEP_Tab;
	} else if (c2 == 'i' && strncmp(mode_str, "insert", n2) == 0) {
		mode = RenderMode::INSERT;
		SetTableName(tbl_name ? tbl_name : "table");
	} else if (c2 == 'q' && strncmp(mode_str, "quote", n2) == 0) {
		mode = RenderMode::QUOTE;
		colSeparator = SEP_Comma;
		rowSeparator = SEP_Row;
	} else if (c2 == 'a' && strncmp(mode_str, "ascii", n2) == 0) {
		mode = RenderMode::ASCII;
		colSeparator = SEP_Unit;
		rowSeparator = SEP_Record;
	} else if (c2 == 'm' && strncmp(mode_str, "markdown", n2) == 0) {
		mode = RenderMode::MARKDOWN;
	} else if (c2 == 't' && strncmp(mode_str, "table", n2) == 0) {
		mode = RenderMode::TABLE;
	} else if (c2 == 'b' && strncmp(mode_str, "box", n2) == 0) {
		mode = RenderMode::BOX;
	} else if (c2 == 'd' && strncmp(mode_str, "duckbox", n2) == 0) {
		mode = RenderMode::DUCKBOX;
	} else if (c2 == 'j' && strncmp(mode_str, "json", n2) == 0) {
		mode = RenderMode::JSON;
	} else if (c2 == 'l' && strncmp(mode_str, "latex", n2) == 0) {
		mode = RenderMode::LATEX;
	} else if (c2 == 't' && strncmp(mode_str, "trash", n2) == 0) {
		mode = RenderMode::TRASH;
	} else if (c2 == 'j' && strncmp(mode_str, "jsonlines", n2) == 0) {
		mode = RenderMode::JSONLINES;
	} else {
		raw_printf(stderr, "Error: mode should be one of: "
		                   "ascii box column csv duckbox html insert json jsonlines latex line "
		                   "list markdown quote table tabs tcl trash \n");
		return false;
	}
	cMode = mode;
	return true;
}